

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_secret.cpp
# Opt level: O1

Value * duckdb::GetConstantExpressionValue(Value *__return_storage_ptr__,ParsedExpression *expr)

{
  ExpressionType EVar1;
  ConstantExpression *pCVar2;
  ColumnRefExpression *pCVar3;
  LogicalType LStack_48;
  string local_30;
  
  EVar1 = (expr->super_BaseExpression).type;
  if (EVar1 == COLUMN_REF) {
    pCVar3 = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    (*(pCVar3->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_30,pCVar3);
    Value::Value(__return_storage_ptr__,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  else if (EVar1 == VALUE_CONSTANT) {
    pCVar2 = BaseExpression::Cast<duckdb::ConstantExpression>(&expr->super_BaseExpression);
    Value::Value(__return_storage_ptr__,&pCVar2->value);
  }
  else {
    LogicalType::LogicalType(&LStack_48,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_48);
    LogicalType::~LogicalType(&LStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static Value GetConstantExpressionValue(ParsedExpression &expr) {
	if (expr.type == ExpressionType::VALUE_CONSTANT) {
		return expr.Cast<ConstantExpression>().value;
	}
	if (expr.type == ExpressionType::COLUMN_REF) {
		return expr.Cast<ColumnRefExpression>().GetName();
	}
	return Value();
}